

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O3

Result * __thiscall
cppqc::
quickCheckOutput<Rectangle,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (Result *__return_storage_ptr__,cppqc *this,
          Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          *prop,ostream *out,size_t maxSuccess,size_t maxDiscarded,size_t maxSize,
          duration<double,_std::ratio<1L,_1L>_> shrinkTimeout,SeedType seed)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  byte bVar3;
  size_t __i;
  ostream *poVar4;
  long lVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  char *pcVar9;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  labels;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelsCollected;
  Input in;
  RngEngine rng;
  char local_14b1;
  undefined1 local_14b0 [32];
  _Base_ptr p_Stack_1490;
  size_t local_1488;
  SeedType local_147c;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1478;
  _Base_ptr local_1470;
  long local_1468;
  undefined1 local_1460 [8];
  _Alloc_hider local_1458;
  char local_1448 [16];
  long local_1438;
  ostream *local_1430;
  size_t local_1428;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_1420;
  pointer local_13f0;
  Result *local_13e8;
  ulong local_13e0;
  char *local_13d8;
  duration<double,_std::ratio<1L,_1L>_> local_13d0;
  size_t local_13c8;
  tuple<Rectangle> local_13c0;
  char *local_13b8 [2];
  char local_13a8 [4976];
  undefined8 local_38;
  
  local_1430 = out;
  local_13d0.__r = shrinkTimeout.__r;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"* Checking property \"",0x15);
  (**(code **)(*(long *)this + 8))(local_13b8,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)prop,local_13b8[0],(long)local_13b8[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" ...",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_13b8[0] != local_13a8) {
    operator_delete(local_13b8[0]);
  }
  local_1428 = (long)local_1430 * 5;
  if (maxSuccess != 0) {
    local_1428 = maxSuccess;
  }
  local_13c8 = 100;
  if (maxDiscarded != 0) {
    local_13c8 = maxDiscarded;
  }
  local_1420._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1420._M_impl.super__Rb_tree_header._M_header;
  local_1420._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1420._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1420._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1420._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1420._M_impl.super__Rb_tree_header._M_header._M_left;
  local_147c = detail::resolveSeed((SeedType)maxSize);
  local_13d8 = (char *)(ulong)local_147c;
  lVar5 = 1;
  pcVar9 = local_13d8;
  do {
    pcVar9 = (char *)(ulong)(((uint)((ulong)pcVar9 >> 0x1e) ^ (uint)pcVar9) * 0x6c078965 +
                            (int)lVar5);
    local_13b8[lVar5] = pcVar9;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_38 = 0x270;
  local_13b8[0] = local_13d8;
  if (local_1430 == (ostream *)0x0) {
    poVar4 = (ostream *)0x0;
    local_1438 = 0;
  }
  else {
    local_1470 = &(__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1478 = &__return_storage_ptr__->labels;
    local_1438 = 0;
    local_1468 = 0;
    poVar4 = (ostream *)0x0;
    do {
      local_13e0 = ((long)poVar4 * local_13c8 + local_1468) / (ulong)local_1430;
      (**(code **)(**(long **)(this + 8) + 0x10))(&local_13c0,*(long **)(this + 8),local_13b8);
      cVar2 = (**(code **)(*(long *)this + 0x30))(this,&local_13c0);
      bVar3 = (**(code **)(*(long *)this + 0x20))(this,&local_13c0);
      local_1438 = local_1438 + (ulong)bVar3;
      (**(code **)(*(long *)this + 0x28))((key_type *)local_14b0,this,&local_13c0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)&local_1420,(key_type *)local_14b0);
      *pmVar6 = *pmVar6 + 1;
      if ((undefined1 *)local_14b0._0_8_ != local_14b0 + 0x10) {
        operator_delete((void *)local_14b0._0_8_);
      }
      if (cVar2 == '\0') {
        bVar3 = (*(code *)**(undefined8 **)this)(this);
        pcVar9 = "+++ OK, failed as expected. ";
        if (bVar3 != 0) {
          pcVar9 = "*** Failed! ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)prop,pcVar9,(ulong)(bVar3 ^ 1) << 4 | 0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)prop,"Starting shrinking...",0x15);
        std::ostream::flush();
        detail::
        doShrink<Rectangle,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
                  ((detail *)local_14b0,
                   (Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                    *)this,&local_13c0,local_13d0,(ostream *)prop);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"done\n",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)prop,"Falsifiable after ",0x12);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
        pcVar9 = " tests";
        if (poVar4 == (ostream *)0x0) {
          pcVar9 = " test";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,pcVar9,(ulong)(poVar4 != (ostream *)0x0) + 5);
        if ((pointer)local_14b0._0_8_ != (pointer)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," and ",5);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
          pcVar9 = " shrinks";
          if ((pointer)local_14b0._0_8_ == (pointer)0x1) {
            pcVar9 = " shrink";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,pcVar9,(ulong)((pointer)local_14b0._0_8_ != (pointer)0x1) + 7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," for input:\n",0xc);
        printInput<Rectangle>((ostream *)prop,&local_13c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)prop,"(To reproduce the test, use ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)prop,"CPPQUICKCHECK_SEED",0x12);
        local_14b1 = '=';
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,&local_14b1,1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
        cVar2 = (*(code *)**(undefined8 **)this)(this);
        if (cVar2 == '\0') {
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_1470;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1470;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          __return_storage_ptr__->result = QC_SUCCESS;
          __return_storage_ptr__->numTests = (size_t)(poVar4 + 1);
          local_14b0._8_4_ = _S_red;
          local_14b0._16_8_ = (_Base_ptr)0x0;
          local_14b0._24_8_ = local_14b0 + 8;
          local_1488 = 0;
          p_Stack_1490 = (_Base_ptr)local_14b0._24_8_;
          for (p_Var7 = local_1420._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != &local_1420._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            local_1460 = *(undefined1 (*) [8])(p_Var7 + 2);
            local_1458._M_p = local_1448;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1458,*(long *)(p_Var7 + 1),
                       (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<unsigned_long,std::__cxx11::string>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                        *)local_14b0,
                       (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1460);
            if (local_1458._M_p != local_1448) {
              operator_delete(local_1458._M_p);
            }
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&local_1478->_M_t);
          if ((_Base_ptr)local_14b0._16_8_ != (_Base_ptr)0x0) {
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 local_14b0._8_4_;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                 = (_Base_ptr)local_14b0._16_8_;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)local_14b0._24_8_;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 p_Stack_1490;
            *(_Base_ptr *)(local_14b0._16_8_ + 8) = local_1470;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 local_1488;
            local_14b0._16_8_ = (_Base_ptr)0x0;
            local_14b0._24_8_ = local_14b0 + 8;
            local_1488 = 0;
            p_Stack_1490 = (_Base_ptr)local_14b0._24_8_;
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_14b0);
          __return_storage_ptr__->seed = local_147c;
        }
        else {
          while (pcVar9 = getenv("CPPQUICKCHECK_LOOP_FAILING_TESTS"), pcVar9 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)prop,"Looping failing test...\n",0x18);
            (**(code **)(*(long *)this + 0x30))(this,&local_13c0);
          }
          local_13f0 = (pointer)local_14b0._0_8_;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               local_1470;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1470;
          (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          __return_storage_ptr__->result = QC_FAILURE;
          __return_storage_ptr__->numTests = (size_t)(poVar4 + 1);
          local_14b0._8_4_ = _S_red;
          local_14b0._16_8_ = (_Base_ptr)0x0;
          local_14b0._24_8_ = local_14b0 + 8;
          local_1488 = 0;
          p_Stack_1490 = (_Base_ptr)local_14b0._24_8_;
          for (p_Var7 = local_1420._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != &local_1420._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            local_1460 = *(undefined1 (*) [8])(p_Var7 + 2);
            local_1458._M_p = local_1448;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1458,*(long *)(p_Var7 + 1),
                       (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<unsigned_long,std::__cxx11::string>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                        *)local_14b0,
                       (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1460);
            if (local_1458._M_p != local_1448) {
              operator_delete(local_1458._M_p);
            }
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&local_1478->_M_t);
          if ((_Base_ptr)local_14b0._16_8_ != (_Base_ptr)0x0) {
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 local_14b0._8_4_;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                 = (_Base_ptr)local_14b0._16_8_;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)local_14b0._24_8_;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 p_Stack_1490;
            *(_Base_ptr *)(local_14b0._16_8_ + 8) = local_1470;
            (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 local_1488;
            local_14b0._16_8_ = (_Base_ptr)0x0;
            local_14b0._24_8_ = local_14b0 + 8;
            local_1488 = 0;
            p_Stack_1490 = (_Base_ptr)local_14b0._24_8_;
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_14b0);
          __return_storage_ptr__->seed = local_147c;
          __return_storage_ptr__->numShrinks = (size_t)local_13f0;
          __return_storage_ptr__->usedSize = local_13e0;
        }
        goto LAB_001060bb;
      }
      poVar4 = poVar4 + 1;
    } while (poVar4 < local_1430);
  }
  local_14b0._24_8_ = local_14b0 + 8;
  local_14b0._8_4_ = _S_red;
  local_14b0._16_8_ = (_Base_ptr)0x0;
  local_1488 = 0;
  p_Stack_1490 = (_Base_ptr)local_14b0._24_8_;
  local_13e8 = __return_storage_ptr__;
  if ((_Rb_tree_header *)local_1420._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1420._M_impl.super__Rb_tree_header) {
    p_Var7 = local_1420._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_1460 = *(undefined1 (*) [8])(p_Var7 + 2);
      local_1458._M_p = local_1448;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1458,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<unsigned_long,std::__cxx11::string>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                  *)local_14b0,
                 (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1460);
      if (local_1458._M_p != local_1448) {
        operator_delete(local_1458._M_p);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_1420._M_impl.super__Rb_tree_header);
  }
  cVar2 = (*(code *)**(undefined8 **)this)(this);
  __return_storage_ptr__ = local_13e8;
  lVar5 = local_1438;
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)prop,"*** Failed! Expected failure but passed ",0x28);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," tests",6);
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," (",2);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"% trivial)",10);
    }
    local_1460[0] = 0x2e;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,local_1460,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    detail::outputLabels
              ((ostream *)prop,(size_t)poVar4,
               (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_14b0);
    p_Var1 = &(__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->result = QC_NO_EXPECTED_FAILURE;
    __return_storage_ptr__->numTests = (size_t)poVar4;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&(__return_storage_ptr__->labels)._M_t,
                (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_14b0);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,"+++ OK, passed ",0xf);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," tests",6);
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop," (",2);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)prop);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"% trivial)",10);
    }
    local_1460[0] = 0x2e;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)prop,local_1460,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    detail::outputLabels
              ((ostream *)prop,(size_t)poVar4,
               (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_14b0);
    p_Var1 = &(__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->result = QC_SUCCESS;
    __return_storage_ptr__->numTests = (size_t)poVar4;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&(__return_storage_ptr__->labels)._M_t,
                (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_14b0);
  }
  __return_storage_ptr__->seed = local_147c;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_14b0);
LAB_001060bb:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_1420);
  return __return_storage_ptr__;
}

Assistant:

Result quickCheckOutput(
    const Property<T0, T1, T2, T3, T4>& prop,
    std::ostream& out = std::cout,
    std::size_t maxSuccess = 100,
    std::size_t maxDiscarded = 0,
    std::size_t maxSize = 0,
    std::chrono::duration<double> shrinkTimeout = DEFAULT_SHRINK_TIMEOUT,
    SeedType seed = USE_DEFAULT_SEED) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  out << "* Checking property \"" << prop.name() << "\" ..." << std::endl;

  if (maxDiscarded == 0)
    maxDiscarded = maxSuccess * 5;
  if (maxSize == 0)
    maxSize = 100;

  std::map<std::string, std::size_t> labelsCollected;
  std::size_t numSuccess = 0, numDiscarded = 0, numTrivial = 0;

  seed = detail::resolveSeed(seed);
  RngEngine rng{seed};
  while (numSuccess < maxSuccess) {
    std::size_t size = (numSuccess * maxSize + numDiscarded) / maxSuccess;
    Input in = prop.generateInput(rng, size);
    try {
      bool success = false;
      try {
        success = prop.checkInput(in);
      } catch (...) {
        out << "Caught exception checking property...\n";
      }

      if (prop.trivialInput(in))
        ++numTrivial;
      ++labelsCollected[prop.classifyInput(in)];

      if (success) {
        ++numSuccess;
      } else {
        if (prop.expect()) {
          out << "*** Failed! ";
        } else {
          out << "+++ OK, failed as expected. ";
        }

        std::size_t numShrinks = 0;
        try {
          out << "Starting shrinking..." << std::flush;
          std::pair<std::size_t, Input> shrinkRes =
              detail::doShrink(prop, in, shrinkTimeout, out);
          numShrinks = shrinkRes.first;
          in = shrinkRes.second;
          out << "done\n";
        } catch (...) {
          out << "WARN: Aborted shrinking because an exception was thrown\n";
        }
        out << "Falsifiable after " << numSuccess + 1
            << (numSuccess == 0 ? " test" : " tests");
        if (numShrinks > 0) {
          out << " and " << numShrinks
              << (numShrinks == 1 ? " shrink" : " shrinks");
        }
        out << " for input:\n";
        printInput(out, in);
        out << "(To reproduce the test, use " << CPPQUICKCHECK_SEED_ENV << '='
            << seed << ")\n";

        if (prop.expect()) {
          while (getenv(CPPQUICKCHECK_LOOP_FAILING_TESTS_ENV) != nullptr) {
            out << "Looping failing test...\n";
            prop.checkInput(in);
          }
          Result ret;
          ret.result = QC_FAILURE;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          ret.numShrinks = numShrinks;
          ret.usedSize = size;
          return ret;
        } else {
          Result ret;
          ret.result = QC_SUCCESS;
          ret.numTests = numSuccess + 1;
          ret.labels = detail::convertLabels(labelsCollected);
          ret.seed = seed;
          return ret;
        }
      }
    } catch (...) {
      if (++numDiscarded >= maxDiscarded) {
        out << "*** Gave up! Passed only " << numSuccess << " tests."
            << std::endl;

        Result ret;
        ret.result = QC_GAVE_UP;
        ret.numTests = numSuccess;
        ret.labels = detail::convertLabels(labelsCollected);
        ret.seed = seed;
        return ret;
      }
    }
  }

  std::multimap<std::size_t, std::string> labels =
      detail::convertLabels(labelsCollected);

  if (prop.expect()) {
    out << "+++ OK, passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_SUCCESS;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  } else {
    out << "*** Failed! Expected failure but passed " << numSuccess << " tests";
    if (numTrivial != 0)
      out << " (" << (100 * numTrivial / numSuccess) << "% trivial)";
    out << '.' << std::endl;
    detail::outputLabels(out, numSuccess, labels);

    Result ret;
    ret.result = QC_NO_EXPECTED_FAILURE;
    ret.numTests = numSuccess;
    ret.labels = labels;
    ret.seed = seed;
    return ret;
  }
}